

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

size_t __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  byte *pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  pointer __s1;
  size_t __n;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  size_t *psVar8;
  uint uVar9;
  
  sVar6 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  iVar2 = *(int *)(this + 0x28);
  uVar7 = ((uint)sVar6 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
  uVar9 = iVar2 + uVar7;
  uVar3 = *(ulong *)(this + 0x18);
  sVar6 = sVar6 >> 5 & uVar3;
  lVar4 = *(long *)(this + 8);
  __s1 = (key->_M_dataplus)._M_p;
  __n = key->_M_string_length;
  psVar8 = (size_t *)(*(long *)this + 0x30 + sVar6 * 0x28);
  uVar7 = uVar7 + iVar2 * 2;
  do {
    if ((uVar9 == *(byte *)(lVar4 + sVar6)) && (__n == psVar8[-5])) {
      if (__n == 0) {
        return sVar6;
      }
      iVar5 = bcmp(__s1,(void *)psVar8[-6],__n);
      if (iVar5 == 0) {
        return sVar6;
      }
    }
    if ((uVar7 == *(byte *)(lVar4 + 1 + sVar6)) && (__n == *psVar8)) {
      if (__n == 0) {
        return sVar6 + 1;
      }
      iVar5 = bcmp(__s1,(void *)psVar8[-1],__n);
      if (iVar5 == 0) {
        return sVar6 + 1;
      }
    }
    uVar9 = uVar9 + iVar2 * 2;
    pbVar1 = (byte *)(lVar4 + 2 + sVar6);
    sVar6 = sVar6 + 2;
    psVar8 = psVar8 + 10;
    uVar7 = uVar7 + iVar2 * 2;
    if (*pbVar1 < uVar9) {
      if (uVar3 == 0) {
        sVar6 = 0;
      }
      else {
        sVar6 = (lVar4 - *(long *)this >> 3) * -0x3333333333333333;
      }
      return sVar6;
    }
  } while( true );
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }